

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

char * xe::getTestCaseTypeName(TestCaseType caseType)

{
  char *pcStack_10;
  TestCaseType caseType_local;
  
  switch(caseType) {
  case TESTCASETYPE_SELF_VALIDATE:
    pcStack_10 = "SelfValidate";
    break;
  case TESTCASETYPE_CAPABILITY:
    pcStack_10 = "Capability";
    break;
  case TESTCASETYPE_ACCURACY:
    pcStack_10 = "Accuracy";
    break;
  case TESTCASETYPE_PERFORMANCE:
    pcStack_10 = "Performance";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* getTestCaseTypeName (TestCaseType caseType)
{
	switch (caseType)
	{
		case TESTCASETYPE_SELF_VALIDATE:	return "SelfValidate";
		case TESTCASETYPE_CAPABILITY:		return "Capability";
		case TESTCASETYPE_ACCURACY:			return "Accuracy";
		case TESTCASETYPE_PERFORMANCE:		return "Performance";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}